

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

sysbvm_tuple_t sysbvm_integer_printString(sysbvm_context_t *context,sysbvm_tuple_t integer)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  size_t stringSize;
  ulong uVar4;
  bool bVar5;
  char buffer [64];
  undefined8 uStack_50;
  byte local_48 [72];
  
  if ((integer & 0xf) == 0) {
    sVar2 = sysbvm_string_createWithCString
                      (context,"TODO: sysbvm_integer_printString for large integer.");
    return sVar2;
  }
  uVar3 = (long)integer >> 4;
  uVar4 = -uVar3;
  if (0 < (long)uVar3) {
    uVar4 = uVar3;
  }
  sVar1 = 1;
  do {
    stringSize = sVar1;
    local_48[stringSize - 1] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
    bVar5 = 9 < uVar4;
    sVar1 = stringSize + 1;
    uVar4 = uVar4 / 10;
  } while (stringSize == 0 || bVar5);
  if ((long)uVar3 < 0) {
    local_48[stringSize] = 0x2d;
    stringSize = stringSize + 1;
  }
  local_48[stringSize] = 0;
  uStack_50 = 0x114d11;
  sVar2 = sysbvm_string_createWithReversedString(context,stringSize,(char *)local_48);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_printString(sysbvm_context_t *context, sysbvm_tuple_t integer)
{
    // Decode the small integer.
    if(sysbvm_tuple_isImmediate(integer))
    {
        sysbvm_stuple_t value = sysbvm_tuple_integer_decodeSmall(integer);
        char buffer[64];
        size_t bufferSize = 0;

        // Work with positive integers.
        bool isNegative = false;
        if(value < 0)
        {
            isNegative = true;
            value = -value;
        }

        // Extract each one of the digits.
        while (value != 0 || bufferSize == 0)
        {
            buffer[bufferSize++] = '0' + (value % 10);
            value /= 10;
        }

        // Add the sign.
        if(isNegative)
            buffer[bufferSize++] = '-';
        buffer[bufferSize] = 0;
        return sysbvm_string_createWithReversedString(context, bufferSize, buffer);
    }

    return sysbvm_string_createWithCString(context, "TODO: sysbvm_integer_printString for large integer.");
}